

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_batch_insert.cpp
# Opt level: O1

PhysicalIndex __thiscall
duckdb::CollectionMerger::Flush(CollectionMerger *this,OptimisticDataWriter *writer)

{
  ClientContext *pCVar1;
  DataTable *pDVar2;
  pointer pPVar3;
  TransactionData transaction;
  bool bVar4;
  reference pvVar5;
  RowGroupCollection *row_groups;
  vector<duckdb::LogicalType,_true> *types;
  RowGroupCollection *this_00;
  PhysicalIndex collection_index;
  size_type __n;
  vector<duckdb::PhysicalIndex,_true> *this_01;
  vector<duckdb::StorageIndex,_true> column_ids;
  DataChunk scan_chunk;
  TableAppendState append_state;
  TableScanState scan_state;
  vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_> local_388;
  TransactionData local_370;
  vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_> local_358;
  DataChunk local_340;
  TableAppendState local_300;
  TableScanState local_200;
  
  if ((this->collection_indexes).
      super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
      super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->collection_indexes).
      super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
      super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    collection_index.index = 0xffffffffffffffff;
  }
  else {
    this_01 = &this->collection_indexes;
    pvVar5 = vector<duckdb::PhysicalIndex,_true>::operator[](this_01,0);
    collection_index.index = pvVar5->index;
    row_groups = DataTable::GetOptimisticCollection(this->data_table,this->context,collection_index)
    ;
    if ((ulong)((long)(this->collection_indexes).
                      super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
                      super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->collection_indexes).
                     super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
                     super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                     ._M_impl.super__Vector_impl_data._M_start) < 9) {
      if (this->batch_type == NOT_FLUSHED) {
        OptimisticDataWriter::WriteLastRowGroup(writer,row_groups);
      }
    }
    else {
      types = RowGroupCollection::GetTypes(row_groups);
      TableAppendState::TableAppendState(&local_300);
      RowGroupCollection::InitializeAppend(row_groups,&local_300);
      DataChunk::DataChunk(&local_340);
      DataChunk::Initialize(&local_340,this->context,types,0x800);
      local_388.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_388.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_388.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_200.table_state.row_group = (RowGroup *)0x0;
      if ((types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
          super__Vector_impl_data._M_start) {
        do {
          ::std::vector<duckdb::StorageIndex,std::allocator<duckdb::StorageIndex>>::
          emplace_back<unsigned_long&>
                    ((vector<duckdb::StorageIndex,std::allocator<duckdb::StorageIndex>> *)&local_388
                     ,(unsigned_long *)&local_200);
          local_200.table_state.row_group =
               (RowGroup *)
               ((long)&((local_200.table_state.row_group)->super_SegmentBase<duckdb::RowGroup>).
                       start + 1);
        } while (local_200.table_state.row_group <
                 (RowGroup *)
                 (((long)(types->
                         super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(types->
                         super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555));
      }
      if (8 < (ulong)((long)(this->collection_indexes).
                            super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                            .
                            super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->collection_indexes).
                           super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                           .
                           super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                           ._M_impl.super__Vector_impl_data._M_start)) {
        __n = 1;
        do {
          pCVar1 = this->context;
          pDVar2 = this->data_table;
          pvVar5 = vector<duckdb::PhysicalIndex,_true>::operator[](this_01,__n);
          this_00 = DataTable::GetOptimisticCollection(pDVar2,pCVar1,(PhysicalIndex)pvVar5->index);
          TableScanState::TableScanState(&local_200);
          ::std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>::vector
                    (&local_358,&local_388);
          TableScanState::Initialize
                    (&local_200,(vector<duckdb::StorageIndex,_true> *)&local_358,
                     (optional_ptr<duckdb::ClientContext,_true>)0x0,
                     (optional_ptr<duckdb::TableFilterSet,_true>)0x0,
                     (optional_ptr<duckdb::SampleOptions,_true>)0x0);
          ::std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>::~vector
                    (&local_358);
          RowGroupCollection::InitializeScan
                    (this_00,&local_200.local_state,(vector<duckdb::StorageIndex,_true> *)&local_388
                     ,(optional_ptr<duckdb::TableFilterSet,_true>)0x0);
          while( true ) {
            DataChunk::Reset(&local_340);
            CollectionScanState::ScanCommitted
                      (&local_200.local_state,&local_340,TABLE_SCAN_COMMITTED_ROWS);
            if (local_340.count == 0) break;
            bVar4 = RowGroupCollection::Append(row_groups,&local_340,&local_300);
            if (bVar4) {
              OptimisticDataWriter::WriteNewRowGroup(writer,row_groups);
            }
          }
          pCVar1 = this->context;
          pDVar2 = this->data_table;
          pvVar5 = vector<duckdb::PhysicalIndex,_true>::operator[](this_01,__n);
          DataTable::ResetOptimisticCollection(pDVar2,pCVar1,(PhysicalIndex)pvVar5->index);
          TableScanState::~TableScanState(&local_200);
          __n = __n + 1;
        } while (__n < (ulong)((long)(this->collection_indexes).
                                     super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                     .
                                     super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->collection_indexes).
                                     super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                     .
                                     super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
      TransactionData::TransactionData(&local_370,0,0);
      transaction.transaction_id = local_370.transaction_id;
      transaction.transaction.ptr = local_370.transaction.ptr;
      transaction.start_time = local_370.start_time;
      RowGroupCollection::FinalizeAppend(row_groups,transaction,&local_300);
      OptimisticDataWriter::WriteLastRowGroup(writer,row_groups);
      ::std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>::~vector
                (&local_388);
      DataChunk::~DataChunk(&local_340);
      TableAppendState::~TableAppendState(&local_300);
    }
    pPVar3 = (this->collection_indexes).
             super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
             super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->collection_indexes).
        super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
        super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl.
        super__Vector_impl_data._M_finish != pPVar3) {
      (this->collection_indexes).
      super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
      super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl.
      super__Vector_impl_data._M_finish = pPVar3;
    }
  }
  return (PhysicalIndex)collection_index.index;
}

Assistant:

PhysicalIndex Flush(OptimisticDataWriter &writer) {
		if (Empty()) {
			return PhysicalIndex(DConstants::INVALID_INDEX);
		}

		auto result_collection_index = collection_indexes[0];
		auto &result_collection = data_table.GetOptimisticCollection(context, result_collection_index);

		if (collection_indexes.size() > 1) {
			// Merge all collections into one result collection.
			auto &types = result_collection.GetTypes();
			TableAppendState append_state;
			result_collection.InitializeAppend(append_state);

			DataChunk scan_chunk;
			scan_chunk.Initialize(context, types);

			vector<StorageIndex> column_ids;
			for (idx_t i = 0; i < types.size(); i++) {
				column_ids.emplace_back(i);
			}
			for (idx_t i = 1; i < collection_indexes.size(); i++) {
				auto &collection = data_table.GetOptimisticCollection(context, collection_indexes[i]);
				TableScanState scan_state;
				scan_state.Initialize(column_ids);
				collection.InitializeScan(scan_state.local_state, column_ids, nullptr);

				while (true) {
					scan_chunk.Reset();
					scan_state.local_state.ScanCommitted(scan_chunk, TableScanType::TABLE_SCAN_COMMITTED_ROWS);
					if (scan_chunk.size() == 0) {
						break;
					}
					auto new_row_group = result_collection.Append(scan_chunk, append_state);
					if (new_row_group) {
						writer.WriteNewRowGroup(result_collection);
					}
				}
				data_table.ResetOptimisticCollection(context, collection_indexes[i]);
			}
			result_collection.FinalizeAppend(TransactionData(0, 0), append_state);
			writer.WriteLastRowGroup(result_collection);
		} else if (batch_type == RowGroupBatchType::NOT_FLUSHED) {
			writer.WriteLastRowGroup(result_collection);
		}

		collection_indexes.clear();
		return result_collection_index;
	}